

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

bool __thiscall cmOrderDirectories::IsImplicitDirectory(cmOrderDirectories *this,string *dir)

{
  bool bVar1;
  _Self local_30;
  _Self local_28;
  string *local_20;
  string *real;
  string *dir_local;
  cmOrderDirectories *this_local;
  
  real = dir;
  dir_local = (string *)this;
  local_20 = GetRealPath(this,dir);
  local_28._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(&this->ImplicitDirectories,local_20);
  local_30._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->ImplicitDirectories);
  bVar1 = std::operator!=(&local_28,&local_30);
  return bVar1;
}

Assistant:

bool cmOrderDirectories::IsImplicitDirectory(std::string const& dir)
{
  std::string const& real = this->GetRealPath(dir);
  return this->ImplicitDirectories.find(real) !=
    this->ImplicitDirectories.end();
}